

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O2

void Aig_ManRegPartitionTraverse_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vLos)

{
  while( true ) {
    if (pObj->TravId == p->nTravIds) {
      return;
    }
    pObj->TravId = p->nTravIds;
    if ((*(uint *)&pObj->field_0x18 & 7) == 2) break;
    Aig_ManRegPartitionTraverse_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vLos)
    ;
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
  }
  if ((pObj->field_5).iData < p->nObjs[2] - p->nRegs) {
    return;
  }
  Vec_PtrPush(vLos,pObj);
  printf("%d ",(ulong)(uint)(((pObj->field_5).iData - p->nObjs[2]) + p->nRegs));
  return;
}

Assistant:

void Aig_ManRegPartitionTraverse_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vLos )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent( p, pObj );
    if ( Aig_ObjIsCi(pObj) )
    {
        if ( pObj->iData >= Aig_ManCiNum(p) - Aig_ManRegNum(p) )
        {
            Vec_PtrPush( vLos, pObj );
            printf( "%d ", pObj->iData - (Aig_ManCiNum(p) - Aig_ManRegNum(p)) );
        }
        return;
    }
    Aig_ManRegPartitionTraverse_rec( p, Aig_ObjFanin0(pObj), vLos );
    Aig_ManRegPartitionTraverse_rec( p, Aig_ObjFanin1(pObj), vLos );
}